

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

rf_image *
rf_image_color_replace_to_buffer
          (rf_image *__return_storage_ptr__,rf_image image,rf_color color,rf_color replace,void *dst
          ,rf_int dst_size)

{
  undefined8 uVar1;
  int iVar2;
  rf_color rVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  bool bVar11;
  rf_color replace_local;
  
  replace_local = replace;
  if ((image.valid == false) ||
     (iVar2 = rf_pixel_buffer_size(image.width,image.height,image.format), dst_size < iVar2)) {
    iVar2 = rf_bytes_per_pixel(image.format);
    uVar4 = 0;
    lVar6 = 0;
    if (0 < (long)image.width) {
      lVar6 = (long)image.width;
    }
    uVar7 = (ulong)(uint)image.height;
    if (image.height < 1) {
      uVar7 = uVar4;
    }
    for (uVar8 = 0; lVar5 = lVar6, uVar10 = uVar4, uVar8 != uVar7; uVar8 = uVar8 + 1) {
      while (bVar11 = lVar5 != 0, lVar5 = lVar5 + -1, bVar11) {
        iVar9 = (int)uVar10;
        rVar3 = rf_format_one_pixel_to_rgba32((void *)((long)image.data + (long)iVar9),image.format)
        ;
        if (rVar3 == color) {
          rf_format_one_pixel(&replace_local,RF_UNCOMPRESSED_R8G8B8A8,
                              (void *)((long)iVar9 + (long)dst),image.format);
        }
        uVar10 = (ulong)(uint)(iVar9 + iVar2);
      }
      uVar4 = (ulong)(uint)((int)uVar4 + image.width * iVar2);
    }
    __return_storage_ptr__->data = image.data;
    __return_storage_ptr__->width = (int)image._8_8_;
    __return_storage_ptr__->height = (int)((ulong)image._8_8_ >> 0x20);
    uVar1 = image._16_8_;
    __return_storage_ptr__->format = (int)uVar1;
    __return_storage_ptr__->valid = (_Bool)(char)((ulong)uVar1 >> 0x20);
    *(int3 *)&__return_storage_ptr__->field_0x15 = (int3)((ulong)uVar1 >> 0x28);
    __return_storage_ptr__->data = dst;
  }
  else {
    __return_storage_ptr__->data = (void *)0x0;
    __return_storage_ptr__->width = 0;
    __return_storage_ptr__->height = 0;
    __return_storage_ptr__->format = 0;
    __return_storage_ptr__->valid = false;
    *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_image_color_replace_to_buffer(rf_image image, rf_color color, rf_color replace, void* dst, rf_int dst_size)
{
    if (image.valid && dst_size >= rf_image_size(image)) return (rf_image) {0};

    rf_image result = {0};

    int bpp = rf_bytes_per_pixel(image.format);

    for (rf_int y = 0; y < image.height; y++)
    {
        for (rf_int x = 0; x < image.width; x++)
        {
            int index = y * image.width + x;

            void* src_pixel = ((unsigned char*)image.data) + index * bpp;
            void* dst_pixel = ((unsigned char*)dst) + index * bpp;

            rf_color pixel_rgba32 = rf_format_one_pixel_to_rgba32(src_pixel, image.format);

            if (rf_color_match(pixel_rgba32, color))
            {
                rf_format_one_pixel(&replace, RF_UNCOMPRESSED_R8G8B8A8, dst_pixel, image.format);
            }
        }
    }

    result = image;
    result.data = dst;

    return result;
}